

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O2

int cuddZddLinearSifting(DdManager *table,int lower,int upper)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  void *__base;
  ulong uVar5;
  DdNode *pDVar6;
  Move *pMVar7;
  DdNode *pDVar8;
  ulong uVar9;
  DdNode *pDVar10;
  long lVar11;
  DdNode *moves;
  
  uVar1 = table->sizeZ;
  empty = table->zero;
  __size = (long)(int)uVar1 * 4;
  piVar4 = (int *)malloc(__size);
  zdd_entry = piVar4;
  if (piVar4 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
    goto LAB_0074720d;
  }
  __base = malloc(__size);
  if (__base == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar5 = 0;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      piVar4[uVar5] = table->subtableZ[table->permZ[uVar5]].keys;
      *(int *)((long)__base + uVar5 * 4) = (int)uVar5;
    }
    qsort(__base,(long)(int)uVar1,4,cuddZddUniqueCompare);
    lVar11 = 0;
    while( true ) {
      uVar2 = table->siftMaxVar;
      if ((int)uVar1 < table->siftMaxVar) {
        uVar2 = uVar1;
      }
      if (((int)uVar2 <= lVar11) || (table->siftMaxSwap <= zddTotalNumberSwapping)) {
        free(__base);
        if (zdd_entry == (int *)0x0) {
          return 1;
        }
        free(zdd_entry);
        zdd_entry = (int *)0x0;
        return 1;
      }
      iVar3 = table->permZ[*(int *)((long)__base + lVar11 * 4)];
      if (iVar3 <= upper && lower <= iVar3) break;
LAB_00746fb1:
      lVar11 = lVar11 + 1;
    }
    uVar2 = table->keysZ;
    if (iVar3 == lower) {
      pDVar6 = (DdNode *)cuddZddLinearDown(table,lower,upper,(Move *)0x0);
      if (pDVar6 == (DdNode *)0xffffffffffffffff) {
LAB_00747181:
        moves = (DdNode *)0x0;
LAB_00747184:
        pDVar6 = (DdNode *)0xffffffffffffffff;
      }
      else {
        iVar3 = cuddZddLinearBackward(table,uVar2,(Move *)pDVar6);
        moves = (DdNode *)0x0;
LAB_007470ce:
        if (iVar3 != 0) {
          while (pDVar6 != (DdNode *)0x0) {
            pDVar8 = (pDVar6->type).kids.T;
            pDVar6->ref = 0;
            pDVar6->next = table->nextFree;
            table->nextFree = pDVar6;
            pDVar6 = pDVar8;
          }
          while (moves != (DdNode *)0x0) {
            pDVar6 = (moves->type).kids.T;
            moves->ref = 0;
            moves->next = table->nextFree;
            table->nextFree = moves;
            moves = pDVar6;
          }
          goto LAB_00746fb1;
        }
      }
    }
    else {
      if (upper == iVar3) {
        moves = (DdNode *)cuddZddLinearUp(table,upper,lower,(Move *)0x0);
        if (moves != (DdNode *)0xffffffffffffffff) {
          iVar3 = cuddZddLinearBackward(table,uVar2,(Move *)moves);
          pDVar6 = (DdNode *)0x0;
          goto LAB_007470ce;
        }
      }
      else {
        if (upper - iVar3 < iVar3 - lower) {
          pDVar6 = (DdNode *)cuddZddLinearDown(table,iVar3,upper,(Move *)0x0);
          if (pDVar6 == (DdNode *)0xffffffffffffffff) goto LAB_00747181;
          pMVar7 = cuddZddUndoMoves(table,(Move *)pDVar6);
          pDVar8 = (DdNode *)cuddZddLinearUp(table,iVar3,lower,pMVar7);
          moves = pDVar8;
          if (pDVar8 != (DdNode *)0xffffffffffffffff) goto LAB_007470bf;
          moves = (DdNode *)0xffffffffffffffff;
          goto LAB_00747195;
        }
        moves = (DdNode *)cuddZddLinearUp(table,iVar3,lower,(Move *)0x0);
        if (moves != (DdNode *)0xffffffffffffffff) {
          pMVar7 = cuddZddUndoMoves(table,(Move *)moves);
          pDVar8 = (DdNode *)cuddZddLinearDown(table,iVar3,upper,pMVar7);
          pDVar6 = pDVar8;
          if (pDVar8 != (DdNode *)0xffffffffffffffff) {
LAB_007470bf:
            iVar3 = cuddZddLinearBackward(table,uVar2,(Move *)pDVar8);
            goto LAB_007470ce;
          }
          goto LAB_00747184;
        }
      }
      moves = (DdNode *)0xffffffffffffffff;
      pDVar6 = (DdNode *)0x0;
    }
LAB_00747195:
    if ((undefined1 *)0x1 < (undefined1 *)((long)&pDVar6->index + 1U)) {
      pDVar8 = table->nextFree;
      do {
        pDVar10 = pDVar6;
        pDVar6 = (pDVar10->type).kids.T;
        pDVar10->ref = 0;
        pDVar10->next = pDVar8;
        pDVar8 = pDVar10;
      } while (pDVar6 != (DdNode *)0x0);
      table->nextFree = pDVar10;
    }
    if ((undefined1 *)0x1 < (undefined1 *)((long)&moves->index + 1U)) {
      pDVar6 = table->nextFree;
      do {
        pDVar8 = moves;
        moves = (pDVar8->type).kids.T;
        pDVar8->ref = 0;
        pDVar8->next = pDVar6;
        pDVar6 = pDVar8;
      } while (moves != (DdNode *)0x0);
      table->nextFree = pDVar8;
    }
  }
  if (zdd_entry != (int *)0x0) {
    free(zdd_entry);
    zdd_entry = (int *)0x0;
  }
LAB_0074720d:
  free(__base);
  return 0;
}

Assistant:

int
cuddZddLinearSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->sizeZ;
    empty = table->zero;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, size);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int, size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, (size_t)size, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar, size); i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
#ifdef DD_STATS
        previousSize = table->keysZ;
#endif
        result = cuddZddLinearAux(table, x, lower, upper);
        if (!result)
            goto cuddZddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ , var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1);

cuddZddSiftingOutOfMem:

    if (zdd_entry != NULL) ABC_FREE(zdd_entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}